

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O2

uint32_t ect_predict(ect *e,single_learner *base,example *ec)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint32_t *puVar4;
  size_t sVar5;
  bool bVar6;
  
  if (e->k == 1) {
    return 1;
  }
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  sVar5 = e->tree_height;
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    do {
      bVar6 = sVar5 == 0;
      sVar5 = sVar5 - 1;
      if (bVar6) {
        puVar4 = (e->final_nodes)._begin + uVar2;
        while( true ) {
          uVar3 = (ulong)*puVar4;
          if (uVar3 < e->k) break;
          LEARNER::learner<char,_example>::learn(base,ec,uVar3 - e->k);
          puVar4 = &(e->directions)._begin[uVar3].left +
                   (e->class_boundary <= (ec->pred).scalar && (ec->pred).scalar != e->class_boundary
                   );
        }
        return *puVar4 + 1;
      }
      uVar3 = (ulong)uVar2 | 1L << (sVar5 & 0x3f);
    } while (e->errors < uVar3);
    LEARNER::learner<char,_example>::learn
              (base,ec,(ulong)(((uVar2 | 1 << ((uint)sVar5 & 0x1f)) + e->last_pair) - 1));
    uVar1 = (uint)uVar3;
    if ((ec->pred).scalar < e->class_boundary || (ec->pred).scalar == e->class_boundary) {
      uVar1 = uVar2;
    }
  } while( true );
}

Assistant:

uint32_t ect_predict(ect& e, single_learner& base, example& ec)
{
  if (e.k == (size_t)1)
    return 1;

  uint32_t finals_winner = 0;

  // Binary final elimination tournament first
  ec.l.simple = {FLT_MAX, 0., 0.};

  for (size_t i = e.tree_height - 1; i != (size_t)0 - 1; i--)
  {
    if ((finals_winner | (((size_t)1) << i)) <= e.errors)
    {
      // a real choice exists
      uint32_t problem_number = e.last_pair + (finals_winner | (((uint32_t)1) << i)) - 1;  // This is unique.

      base.learn(ec, problem_number);

      if (ec.pred.scalar > e.class_boundary)
        finals_winner = finals_winner | (((size_t)1) << i);
    }
  }

  uint32_t id = e.final_nodes[finals_winner];
  while (id >= e.k)
  {
    base.learn(ec, id - e.k);

    if (ec.pred.scalar > e.class_boundary)
      id = e.directions[id].right;
    else
      id = e.directions[id].left;
  }
  return id + 1;
}